

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_rep_cycles.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true>_>_>
::update_representative_cycles
          (RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true>_>_>
           *this)

{
  pointer pvVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  puVar3 = (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_48._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->birthToCycle_,
             (ulong)*(uint *)&this[2].representativeCycles_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (value_type_conflict *)&local_48);
  for (uVar4 = 0;
      uVar4 < *(uint *)&this[2].representativeCycles_.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage; uVar4 = uVar4 + 1) {
    puVar2 = this[1].birthToCycle_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + uVar4 * 0xe + 10;
    puVar3 = *(pointer *)puVar2;
    if (puVar3 == (pointer)0x0 || puVar3 == puVar2) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      puVar2 = this[2].birthToCycle_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar4 * 0xe + 10;
      puVar3 = puVar2;
      while( true ) {
        puVar3 = *(pointer *)puVar3;
        pvVar1 = (this->representativeCycles_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar3 == puVar2) break;
        local_48._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,puVar3[4]);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (pvVar1 + -1,(uint *)&local_48);
      }
      (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           (int)(((long)pvVar1 -
                 (long)(this->representativeCycles_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18) - 1;
    }
  }
  return;
}

Assistant:

inline void RU_representative_cycles<Master_matrix>::update_representative_cycles() 
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    birthToCycle_.clear();
    birthToCycle_.resize(_matrix()->reducedMatrixR_.get_number_of_columns(), -1);
    Index c = 0;
    for (Index i = 0; i < _matrix()->reducedMatrixR_.get_number_of_columns(); i++) {
      if (_matrix()->reducedMatrixR_.is_zero_column(i)) {
        birthToCycle_[i] = c;
        ++c;
      }
    }
    representativeCycles_.clear();
    representativeCycles_.resize(c);
    for (Index i = 0; i < _matrix()->mirrorMatrixU_.get_number_of_columns(); i++) {
      for (const auto& entry : _matrix()->mirrorMatrixU_.get_column(i)) {
        auto idx = birthToCycle_[entry.get_row_index()];
        if (idx != Master_matrix::template get_null_value<Index>()) {
          representativeCycles_[idx].push_back(i);
        }
      }
    }
  } else {
    birthToCycle_.clear();
    birthToCycle_.resize(_matrix()->reducedMatrixR_.get_number_of_columns(), -1);
    for (Index i = 0; i < _matrix()->reducedMatrixR_.get_number_of_columns(); i++) {
      if (_matrix()->reducedMatrixR_.is_zero_column(i)) {
        representativeCycles_.push_back(Cycle());
        for (const auto& entry : _matrix()->mirrorMatrixU_.get_column(i)) {
          representativeCycles_.back().push_back(entry.get_row_index());
        }
        if constexpr (std::is_same_v<typename Master_matrix::Column, typename Master_matrix::Matrix_heap_column> ||
                      std::is_same_v<typename Master_matrix::Column,
                                     typename Master_matrix::Matrix_unordered_set_column>)
          std::sort(representativeCycles_.back().begin(), representativeCycles_.back().end());
        birthToCycle_[i] = representativeCycles_.size() - 1;
      }
    }
  }
}